

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

int secp256k1_scalar_shr_int(secp256k1_scalar *r,int n)

{
  ulong *puVar1;
  secp256k1_fe *b;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint64_t uVar45;
  uint64_t uVar46;
  uint64_t uVar47;
  uint64_t uVar48;
  int iVar49;
  int iVar50;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  undefined1 *puVar51;
  ulong uVar52;
  undefined1 *extraout_RAX;
  undefined1 *extraout_RAX_00;
  undefined1 *puVar53;
  byte bVar54;
  secp256k1_gej *in_RCX;
  byte bVar55;
  secp256k1_fe *r_00;
  long extraout_RDX;
  ulong uVar56;
  secp256k1_fe *a;
  secp256k1_fe *psVar57;
  ulong uVar58;
  secp256k1_ge *a_00;
  undefined4 in_register_00000034;
  uint64_t *puVar59;
  ulong uVar60;
  secp256k1_gej *a_01;
  ulong uVar61;
  secp256k1_gej *r_01;
  secp256k1_gej *r_02;
  long lVar62;
  undefined1 *puVar63;
  undefined1 auStack_2b8 [128];
  ulong uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  long lStack_220;
  undefined8 uStack_218;
  secp256k1_gej sStack_1d0;
  secp256k1_gej sStack_138;
  secp256k1_ge sStack_a0;
  
  puVar59 = (uint64_t *)CONCAT44(in_register_00000034,n);
  if (n < 1) {
    secp256k1_scalar_shr_int_cold_2();
  }
  else if ((uint)n < 0x10) {
    bVar54 = (byte)n;
    uVar58 = r->d[0];
    uVar52 = r->d[1];
    bVar55 = -bVar54;
    r->d[0] = (uVar52 << (bVar55 & 0x3f)) + (uVar58 >> (bVar54 & 0x3f));
    r->d[1] = (r->d[2] << (bVar55 & 0x3f)) + (uVar52 >> (bVar54 & 0x3f));
    r->d[2] = (r->d[3] << (bVar55 & 0x3f)) + (r->d[2] >> (bVar54 & 0x3f));
    r->d[3] = r->d[3] >> (bVar54 & 0x3f);
    return ~(-1 << (bVar54 & 0x1f)) & (uint)uVar58;
  }
  secp256k1_scalar_shr_int_cold_1();
  if (in_RCX->infinity == 0) {
    secp256k1_gej_double_var(&sStack_138,in_RCX,(secp256k1_fe *)0x0);
    secp256k1_ge_set_xy(&sStack_a0,&sStack_138.x,&sStack_138.y);
    secp256k1_ge_set_gej_zinv((secp256k1_ge *)r,in_RCX,&sStack_138.z);
    secp256k1_gej_set_ge(&sStack_1d0,(secp256k1_ge *)r);
    sStack_1d0.z.n[0] = (in_RCX->z).n[0];
    sStack_1d0.z.n[1] = (in_RCX->z).n[1];
    sStack_1d0.z.n[2] = (in_RCX->z).n[2];
    sStack_1d0.z.n[3] = (in_RCX->z).n[3];
    sStack_1d0.z.n[4] = (in_RCX->z).n[4];
    sStack_1d0.z.magnitude = (in_RCX->z).magnitude;
    sStack_1d0.z.normalized = (in_RCX->z).normalized;
    puVar59[4] = sStack_138.z.n[4];
    puVar59[5] = sStack_138.z._40_8_;
    puVar59[2] = sStack_138.z.n[2];
    puVar59[3] = sStack_138.z.n[3];
    *puVar59 = sStack_138.z.n[0];
    puVar59[1] = sStack_138.z.n[1];
    lVar62 = 0x30;
    do {
      r = (secp256k1_scalar *)((long)r + 0x68);
      secp256k1_gej_add_ge_var
                (&sStack_1d0,&sStack_1d0,&sStack_a0,(secp256k1_fe *)((long)puVar59 + lVar62));
      secp256k1_ge_set_xy((secp256k1_ge *)r,&sStack_1d0.x,&sStack_1d0.y);
      lVar62 = lVar62 + 0x30;
    } while (lVar62 != 0x180);
    secp256k1_fe_mul(r_00,&sStack_1d0.z,&sStack_138.z);
    return extraout_EAX;
  }
  secp256k1_ecmult_odd_multiples_table_cold_1();
  puVar51 = &((secp256k1_ge *)((long)r + -0x68))->field_0x67;
  puVar53 = puVar51;
  if ((secp256k1_ge *)r != (secp256k1_ge *)0x0) {
    secp256k1_ge_verify((secp256k1_ge *)(puVar59 + (long)puVar51 * 0xd));
    lVar62 = (long)puVar51 * 0x30;
    secp256k1_fe_verify((secp256k1_fe *)(extraout_RDX + lVar62));
    psVar57 = (secp256k1_fe *)(puVar59 + (long)puVar51 * 0xd + 6);
    secp256k1_fe_verify(psVar57);
    uVar58 = puVar59[(long)puVar51 * 0xd + 10];
    uVar56 = (uVar58 >> 0x30) * 0x1000003d1 + psVar57->n[0];
    uVar52 = (uVar56 >> 0x34) + puVar59[(long)puVar51 * 0xd + 7];
    uVar60 = (uVar52 >> 0x34) + puVar59[(long)puVar51 * 0xd + 8];
    uVar61 = (uVar60 >> 0x34) + puVar59[(long)puVar51 * 0xd + 9];
    a_01 = (secp256k1_gej *)(uVar60 & 0xfffffffffffff);
    psVar57->n[0] = uVar56 & 0xfffffffffffff;
    puVar59[(long)puVar51 * 0xd + 7] = uVar52 & 0xfffffffffffff;
    puVar59[(long)puVar51 * 0xd + 8] = (uint64_t)a_01;
    puVar59[(long)puVar51 * 0xd + 9] = uVar61 & 0xfffffffffffff;
    puVar59[(long)puVar51 * 0xd + 10] = (uVar61 >> 0x34) + (uVar58 & 0xffffffffffff);
    *(undefined4 *)(puVar59 + (long)puVar51 * 0xd + 0xb) = 1;
    secp256k1_fe_verify(psVar57);
    auStack_2b8._0_8_ = *(ulong *)(extraout_RDX + lVar62);
    auStack_2b8._8_8_ = ((ulong *)(extraout_RDX + lVar62))[1];
    puVar1 = (ulong *)(extraout_RDX + 0x10 + lVar62);
    auStack_2b8._16_8_ = *puVar1;
    auStack_2b8._24_8_ = puVar1[1];
    puVar1 = (ulong *)(extraout_RDX + 0x20 + lVar62);
    auStack_2b8._32_8_ = *puVar1;
    auStack_2b8._40_8_ = puVar1[1];
    puVar53 = extraout_RAX;
    if (puVar51 != (undefined1 *)0x0) {
      a_00 = (secp256k1_ge *)(puVar59 + (long)r * 0xd + -0x1a);
      psVar57 = (secp256k1_fe *)(extraout_RDX + (long)r * 0x30);
      puVar63 = (undefined1 *)0x0;
      do {
        r_02 = (secp256k1_gej *)auStack_2b8;
        psVar57 = psVar57 + -1;
        secp256k1_fe_verify(psVar57);
        secp256k1_ge_verify(a_00 + 1);
        if (puVar63 != (undefined1 *)0x0) {
          a_01 = r_02;
          secp256k1_fe_mul((secp256k1_fe *)r_02,(secp256k1_fe *)r_02,psVar57);
        }
        secp256k1_ge_verify(a_00);
        r_01 = r_02;
        secp256k1_fe_verify((secp256k1_fe *)r_02);
        if (a_00->infinity != 0) {
          secp256k1_ge_table_set_globalz_cold_1();
LAB_0014b378:
          secp256k1_ge_table_set_globalz_cold_2();
          secp256k1_gej_verify(a_01);
          if (a_01->infinity == 0) {
            if (a != (secp256k1_fe *)0x0) {
              uVar45 = (a_01->y).n[0];
              uVar46 = (a_01->y).n[1];
              uVar47 = (a_01->y).n[2];
              uVar48 = (a_01->y).n[3];
              iVar49 = (a_01->y).magnitude;
              iVar50 = (a_01->y).normalized;
              a->n[4] = (a_01->y).n[4];
              a->magnitude = iVar49;
              a->normalized = iVar50;
              a->n[2] = uVar47;
              a->n[3] = uVar48;
              a->n[0] = uVar45;
              a->n[1] = uVar46;
              secp256k1_fe_verify(a);
              uVar58 = a->n[4];
              uVar56 = (uVar58 >> 0x30) * 0x1000003d1 + a->n[0];
              uVar52 = (uVar56 >> 0x34) + a->n[1];
              uVar60 = (uVar52 >> 0x34) + a->n[2];
              uVar61 = (uVar60 >> 0x34) + a->n[3];
              a->n[0] = uVar56 & 0xfffffffffffff;
              a->n[1] = uVar52 & 0xfffffffffffff;
              a->n[2] = uVar60 & 0xfffffffffffff;
              a->n[3] = uVar61 & 0xfffffffffffff;
              a->n[4] = (uVar61 >> 0x34) + (uVar58 & 0xffffffffffff);
              a->magnitude = 1;
              secp256k1_fe_verify(a);
            }
            secp256k1_gej_double(r_01,a_01);
            secp256k1_gej_verify(r_01);
            return extraout_EAX_02;
          }
          secp256k1_gej_set_infinity(r_01);
          if (a != (secp256k1_fe *)0x0) {
            a->n[0] = 1;
            a->n[1] = 0;
            a->n[2] = 0;
            a->n[3] = 0;
            a->n[4] = 0;
            a->magnitude = 1;
            a->normalized = 1;
            secp256k1_fe_verify(a);
            return extraout_EAX_01;
          }
          return extraout_EAX_00;
        }
        secp256k1_fe_verify((secp256k1_fe *)r_02);
        r_01 = r_02;
        if (8 < (int)auStack_2b8._40_4_) goto LAB_0014b378;
        b = (secp256k1_fe *)(auStack_2b8 + 0x78);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = auStack_2b8._0_8_ * 2;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = auStack_2b8._24_8_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = auStack_2b8._8_8_ * 2;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = auStack_2b8._16_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = auStack_2b8._32_8_;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = auStack_2b8._32_8_;
        uVar52 = SUB168(auVar4 * auVar24,0);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar52 & 0xfffffffffffff;
        auVar2 = auVar3 * auVar23 + auVar2 * auVar22 + auVar5 * ZEXT816(0x1000003d10);
        uVar58 = auVar2._0_8_;
        auStack_2b8._72_8_ = uVar58 & 0xfffffffffffff;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar58 >> 0x34 | auVar2._8_8_ << 0xc;
        uVar58 = auStack_2b8._32_8_ * 2;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = auStack_2b8._0_8_;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar58;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = auStack_2b8._8_8_ * 2;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = auStack_2b8._24_8_;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auStack_2b8._16_8_;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = auStack_2b8._16_8_;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar52 >> 0x34 | SUB168(auVar4 * auVar24,8) << 0xc;
        auVar2 = auVar6 * auVar25 + auVar38 + auVar7 * auVar26 + auVar8 * auVar27 +
                 auVar9 * ZEXT816(0x1000003d10);
        auStack_2b8._64_8_ = auVar2._0_8_;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = (ulong)auStack_2b8._64_8_ >> 0x34 | auVar2._8_8_ << 0xc;
        auStack_2b8._56_8_ = (auStack_2b8._64_8_ & 0xfffffffffffff) >> 0x30;
        auStack_2b8._64_8_ = auStack_2b8._64_8_ & 0xffffffffffff;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = auStack_2b8._0_8_;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = auStack_2b8._0_8_;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = auStack_2b8._8_8_;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar58;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = auStack_2b8._16_8_ * 2;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = auStack_2b8._24_8_;
        auVar2 = auVar11 * auVar29 + auVar39 + auVar12 * auVar30;
        uVar52 = auVar2._0_8_;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar52 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = (uVar52 & 0xfffffffffffff) << 4 | auStack_2b8._56_8_;
        auVar2 = auVar10 * auVar28 + ZEXT816(0x1000003d1) * auVar31;
        uVar52 = auVar2._0_8_;
        auStack_2b8._120_8_ = uVar52 & 0xfffffffffffff;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar52 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = auStack_2b8._0_8_ * 2;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = auStack_2b8._8_8_;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = auStack_2b8._16_8_;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar58;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = auStack_2b8._24_8_;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = auStack_2b8._24_8_;
        auVar3 = auVar14 * auVar33 + auVar41 + auVar15 * auVar34;
        uVar52 = auVar3._0_8_;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar52 & 0xfffffffffffff;
        auVar2 = auVar13 * auVar32 + auVar40 + auVar16 * ZEXT816(0x1000003d10);
        uVar56 = auVar2._0_8_;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar52 >> 0x34 | auVar3._8_8_ << 0xc;
        uStack_238 = uVar56 & 0xfffffffffffff;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar56 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = auStack_2b8._0_8_ * 2;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = auStack_2b8._16_8_;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = auStack_2b8._8_8_;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = auStack_2b8._8_8_;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = auStack_2b8._24_8_;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar58;
        auVar43 = auVar19 * auVar37 + auVar43;
        uVar58 = auVar43._0_8_;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar58 & 0xfffffffffffff;
        auVar2 = auVar17 * auVar35 + auVar42 + auVar18 * auVar36 + auVar20 * ZEXT816(0x1000003d10);
        uVar52 = auVar2._0_8_;
        uStack_230 = uVar52 & 0xfffffffffffff;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = (uVar52 >> 0x34 | auVar2._8_8_ << 0xc) + auStack_2b8._72_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar58 >> 0x34 | auVar43._8_8_ << 0xc;
        auVar44 = auVar21 * ZEXT816(0x1000003d10) + auVar44;
        uVar58 = auVar44._0_8_;
        uStack_228 = uVar58 & 0xfffffffffffff;
        lStack_220 = (uVar58 >> 0x34 | auVar44._8_8_ << 0xc) + auStack_2b8._64_8_;
        uStack_218 = 1;
        secp256k1_fe_verify(b);
        secp256k1_fe_mul((secp256k1_fe *)(auStack_2b8 + 0x48),b,(secp256k1_fe *)auStack_2b8);
        secp256k1_fe_mul(&a_00->x,&a_00->x,b);
        a_01 = (secp256k1_gej *)&a_00->y;
        secp256k1_fe_mul((secp256k1_fe *)a_01,(secp256k1_fe *)a_01,
                         (secp256k1_fe *)(auStack_2b8 + 0x48));
        secp256k1_ge_verify(a_00);
        secp256k1_ge_verify(a_00);
        puVar63 = puVar63 + 1;
        a_00 = a_00 + -1;
        puVar53 = extraout_RAX_00;
      } while (puVar51 != puVar63);
    }
  }
  return (int)puVar53;
}

Assistant:

static int secp256k1_scalar_shr_int(secp256k1_scalar *r, int n) {
    int ret;
    VERIFY_CHECK(n > 0);
    VERIFY_CHECK(n < 16);
    ret = r->d[0] & ((1 << n) - 1);
    r->d[0] = (r->d[0] >> n) + (r->d[1] << (64 - n));
    r->d[1] = (r->d[1] >> n) + (r->d[2] << (64 - n));
    r->d[2] = (r->d[2] >> n) + (r->d[3] << (64 - n));
    r->d[3] = (r->d[3] >> n);
    return ret;
}